

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaK_exp2anyreg(FuncState *fs,expdesc *e)

{
  int reg;
  
  luaK_dischargevars(fs,e);
  if (e->k == VNONRELOC) {
    if (e->t == e->f) goto LAB_0010de4e;
    reg = (e->u).s.info;
    if ((int)(uint)fs->nactvar <= reg) {
      exp2reg(fs,e,reg);
      goto LAB_0010de4e;
    }
  }
  luaK_exp2nextreg(fs,e);
LAB_0010de4e:
  return (e->u).s.info;
}

Assistant:

static int luaK_exp2anyreg(FuncState*fs,expdesc*e){
luaK_dischargevars(fs,e);
if(e->k==VNONRELOC){
if(!hasjumps(e))return e->u.s.info;
if(e->u.s.info>=fs->nactvar){
exp2reg(fs,e,e->u.s.info);
return e->u.s.info;
}
}
luaK_exp2nextreg(fs,e);
return e->u.s.info;
}